

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall stick::String::String(String *this,char *_c,Allocator *_alloc)

{
  size_t _count;
  
  this->m_cStr = (char *)0x0;
  this->m_length = 0;
  this->m_capacity = 0;
  this->m_allocator = _alloc;
  _count = strlen(_c);
  if (_count != 0) {
    resize(this,_count);
    strcpy(this->m_cStr,_c);
    return;
  }
  return;
}

Assistant:

inline String(const char * _c, Allocator & _alloc = defaultAllocator()) :
        m_cStr(nullptr),
        m_length(0),
        m_capacity(0),
        m_allocator(&_alloc)
    {
        Size l = strlen(_c);
        if (l)
        {
            resize(l);
            strcpy(m_cStr, _c);
        }
    }